

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

void ssh2_write_kexinit_lists
               (BinarySink *pktout,kexinit_algorithm_list *kexlists,Conf *conf,SshServerConfig *ssc,
               int remote_bugs,char *hk_host,int hk_port,ssh_keyalg *hk_prev,
               ssh_transient_hostkey_cache *thc,tree234 *host_cas,ssh_key **our_hostkeys,
               int our_nhostkeys,_Bool first_time,_Bool can_gssapi_keyex,
               _Bool transient_hostkey_mode)

{
  ssh_kexes *psVar1;
  ssh2_ciphers *psVar2;
  ssh_compression_alg *psVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  long lVar8;
  kexinit_algorithm *pkVar9;
  ssh_keyalg *self;
  char *name_00;
  host_ca_enum *handle_00;
  host_ca *hca_00;
  ssh_signkey_with_user_pref_id *psVar10;
  strbuf *psVar11;
  strbuf *list;
  ssh_compression_alg *c_1;
  ssh2_ciphers *c;
  ssh_signkey_with_user_pref_id *a_2;
  ssh_signkey_with_user_pref_id *a_1;
  ssh_signkey_with_user_pref_id *a;
  host_ca *hca;
  strbuf *name;
  host_ca_enum *handle;
  ulong uStack_140;
  _Bool accept_certs;
  size_t i_1;
  uint32_t supported_flags;
  ssh_keyalg *keyalg;
  ssh_kexes *k_1;
  int id;
  kexinit_algorithm *alg;
  ssh2_macalg **ppsStack_108;
  int nmacs;
  ssh2_macalg **maclist;
  ssh_compression_alg *preferred_comp;
  ssh2_ciphers *preferred_ciphers [7];
  int iStack_b8;
  int n_preferred_ciphers;
  int preferred_hk [6];
  int n_preferred_hk;
  ssh_kexes *preferred_kex [8];
  int n_preferred_kex;
  uint uStack_4c;
  _Bool warn;
  int k;
  int j;
  int i;
  _Bool transient_hostkey_mode_local;
  _Bool can_gssapi_keyex_local;
  _Bool first_time_local;
  char *hk_host_local;
  int remote_bugs_local;
  SshServerConfig *ssc_local;
  Conf *conf_local;
  kexinit_algorithm_list *kexlists_local;
  BinarySink *pktout_local;
  
  preferred_kex[7]._1_3_ = 0;
  preferred_kex[7]._0_1_ = can_gssapi_keyex;
  for (k = 0; k < 7; k = k + 1) {
    iVar6 = conf_get_int_int(conf,0x18,k);
    switch(iVar6) {
    case 0:
      if (k < 6) {
        lVar8 = (long)(int)(uint)preferred_kex[7];
        preferred_kex[7]._0_4_ = (uint)preferred_kex[7] + 1;
        preferred_kex[lVar8 + -1] = (ssh_kexes *)0x0;
      }
      break;
    case 1:
      lVar8 = (long)(int)(uint)preferred_kex[7];
      preferred_kex[7]._0_4_ = (uint)preferred_kex[7] + 1;
      preferred_kex[lVar8 + -1] = &ssh_diffiehellman_group1;
      break;
    case 2:
      lVar8 = (long)(int)(uint)preferred_kex[7];
      preferred_kex[7]._0_4_ = (uint)preferred_kex[7] + 1;
      preferred_kex[lVar8 + -1] = &ssh_diffiehellman_group14;
      break;
    case 3:
      lVar8 = (long)(int)(uint)preferred_kex[7];
      preferred_kex[7]._0_4_ = (uint)preferred_kex[7] + 1;
      preferred_kex[lVar8 + -1] = &ssh_diffiehellman_gex;
      break;
    case 4:
      lVar8 = (long)(int)(uint)preferred_kex[7];
      preferred_kex[7]._0_4_ = (uint)preferred_kex[7] + 1;
      preferred_kex[lVar8 + -1] = &ssh_rsa_kex;
      break;
    case 5:
      lVar8 = (long)(int)(uint)preferred_kex[7];
      preferred_kex[7]._0_4_ = (uint)preferred_kex[7] + 1;
      preferred_kex[lVar8 + -1] = &ssh_ecdh_kex;
      break;
    case 6:
      lVar8 = (long)(int)(uint)preferred_kex[7];
      preferred_kex[7]._0_4_ = (uint)preferred_kex[7] + 1;
      preferred_kex[lVar8 + -1] = &ssh_ntru_hybrid_kex;
    }
  }
  preferred_hk[5] = 0;
  for (k = 0; k < 6; k = k + 1) {
    iVar6 = conf_get_int_int(conf,0x19,k);
    if ((iVar6 != 0) || (k < 5)) {
      lVar8 = (long)preferred_hk[5];
      preferred_hk[5] = preferred_hk[5] + 1;
      (&iStack_b8)[lVar8] = iVar6;
    }
  }
  preferred_ciphers[6]._4_4_ = 0;
  for (k = 0; k < 7; k = k + 1) {
    iVar6 = conf_get_int_int(conf,0x20,k);
    switch(iVar6) {
    case 0:
      if (k < 6) {
        lVar8 = (long)preferred_ciphers[6]._4_4_;
        preferred_ciphers[6]._4_4_ = preferred_ciphers[6]._4_4_ + 1;
        preferred_ciphers[lVar8 + -1] = (ssh2_ciphers *)0x0;
      }
      break;
    case 1:
      lVar8 = (long)preferred_ciphers[6]._4_4_;
      preferred_ciphers[6]._4_4_ = preferred_ciphers[6]._4_4_ + 1;
      preferred_ciphers[lVar8 + -1] = &ssh2_3des;
      break;
    case 2:
      lVar8 = (long)preferred_ciphers[6]._4_4_;
      preferred_ciphers[6]._4_4_ = preferred_ciphers[6]._4_4_ + 1;
      preferred_ciphers[lVar8 + -1] = &ssh2_blowfish;
      break;
    case 3:
      lVar8 = (long)preferred_ciphers[6]._4_4_;
      preferred_ciphers[6]._4_4_ = preferred_ciphers[6]._4_4_ + 1;
      preferred_ciphers[lVar8 + -1] = &ssh2_aes;
      break;
    case 4:
      _Var5 = conf_get_bool(conf,0x24);
      if (_Var5) {
        lVar8 = (long)preferred_ciphers[6]._4_4_;
        preferred_ciphers[6]._4_4_ = preferred_ciphers[6]._4_4_ + 1;
        preferred_ciphers[lVar8 + -1] = &ssh2_des;
      }
      break;
    case 5:
      lVar8 = (long)preferred_ciphers[6]._4_4_;
      preferred_ciphers[6]._4_4_ = preferred_ciphers[6]._4_4_ + 1;
      preferred_ciphers[lVar8 + -1] = &ssh2_arcfour;
      break;
    case 6:
      lVar8 = (long)preferred_ciphers[6]._4_4_;
      preferred_ciphers[6]._4_4_ = preferred_ciphers[6]._4_4_ + 1;
      preferred_ciphers[lVar8 + -1] = &ssh2_ccp;
    }
  }
  _Var5 = conf_get_bool(conf,0x17);
  if (_Var5) {
    maclist = (ssh2_macalg **)&ssh_zlib;
  }
  else {
    maclist = (ssh2_macalg **)&ssh_comp_none;
  }
  for (k = 0; k < 8; k = k + 1) {
    kexlists[k].nalgs = 0;
  }
  preferred_kex[7]._7_1_ = 0;
  for (k = 0; k < (int)(uint)preferred_kex[7]; k = k + 1) {
    psVar1 = preferred_kex[(long)k + -1];
    if (psVar1 == (ssh_kexes *)0x0) {
      preferred_kex[7]._7_1_ = 1;
    }
    else {
      for (uStack_4c = 0; (int)uStack_4c < psVar1->nkexes; uStack_4c = uStack_4c + 1) {
        pkVar9 = ssh2_kexinit_addalg(kexlists,psVar1->list[(int)uStack_4c]->name);
        (pkVar9->u).kex.kex = psVar1->list[(int)uStack_4c];
        (pkVar9->u).kex.warn = (_Bool)(preferred_kex[7]._7_1_ & 1);
      }
    }
  }
  if (our_hostkeys == (ssh_key **)0x0) {
    if (first_time) {
      bVar4 = false;
      handle_00 = enum_host_ca_start();
      if (handle_00 != (host_ca_enum *)0x0) {
        psVar11 = strbuf_new();
        while( true ) {
          strbuf_clear(psVar11);
          _Var5 = enum_host_ca_next(handle_00,psVar11);
          if (!_Var5) break;
          hca_00 = host_ca_load(psVar11->s);
          if (hca_00 != (host_ca *)0x0) {
            if ((hca_00->ca_public_key == (strbuf *)0x0) ||
               (_Var5 = cert_expr_match_str(hca_00->validity_expression,hk_host,hk_port), !_Var5)) {
              host_ca_free(hca_00);
            }
            else {
              bVar4 = true;
              add234(host_cas,hca_00);
            }
          }
        }
        enum_host_ca_finish(handle_00);
        strbuf_free(psVar11);
      }
      if (bVar4) {
        preferred_kex[7]._7_1_ = 0;
        for (k = 0; k < preferred_hk[5]; k = k + 1) {
          if ((&iStack_b8)[k] == 0) {
            preferred_kex[7]._7_1_ = 1;
          }
          for (uStack_4c = 0; uStack_4c < 0x11; uStack_4c = uStack_4c + 1) {
            psVar10 = ssh2_hostkey_algs + (int)uStack_4c;
            if (((psVar10->alg->is_certificate & 1U) != 0) &&
               (ssh2_hostkey_algs[(int)uStack_4c].id == (&iStack_b8)[k])) {
              pkVar9 = ssh2_kexinit_addalg(kexlists + 1,psVar10->alg->ssh_id);
              (pkVar9->u).hk.hostkey = psVar10->alg;
              (pkVar9->u).hk.warn = (_Bool)(preferred_kex[7]._7_1_ & 1);
            }
          }
        }
      }
      preferred_kex[7]._7_1_ = 0;
      for (k = 0; k < preferred_hk[5]; k = k + 1) {
        if ((&iStack_b8)[k] == 0) {
          preferred_kex[7]._7_1_ = 1;
        }
        for (uStack_4c = 0; uStack_4c < 0x11; uStack_4c = uStack_4c + 1) {
          psVar10 = ssh2_hostkey_algs + (int)uStack_4c;
          if (((((psVar10->alg->is_certificate & 1U) == 0) || (!bVar4)) &&
              (ssh2_hostkey_algs[(int)uStack_4c].id == (&iStack_b8)[k])) &&
             ((_Var5 = conf_get_bool(conf,0x1a), _Var5 &&
              (_Var5 = have_ssh_host_key(hk_host,hk_port,psVar10->alg->cache_id), _Var5)))) {
            pkVar9 = ssh2_kexinit_addalg(kexlists + 1,psVar10->alg->ssh_id);
            (pkVar9->u).hk.hostkey = psVar10->alg;
            (pkVar9->u).hk.warn = (_Bool)(preferred_kex[7]._7_1_ & 1);
          }
        }
      }
      preferred_kex[7]._7_1_ = 0;
      for (k = 0; k < preferred_hk[5]; k = k + 1) {
        if ((&iStack_b8)[k] == 0) {
          preferred_kex[7]._7_1_ = 1;
        }
        for (uStack_4c = 0; uStack_4c < 0x11; uStack_4c = uStack_4c + 1) {
          psVar10 = ssh2_hostkey_algs + (int)uStack_4c;
          if (((psVar10->alg->is_certificate & 1U) == 0) &&
             (ssh2_hostkey_algs[(int)uStack_4c].id == (&iStack_b8)[k])) {
            pkVar9 = ssh2_kexinit_addalg(kexlists + 1,psVar10->alg->ssh_id);
            (pkVar9->u).hk.hostkey = psVar10->alg;
            (pkVar9->u).hk.warn = (_Bool)(preferred_kex[7]._7_1_ & 1);
          }
        }
      }
    }
    else if (transient_hostkey_mode) {
      preferred_kex[7]._7_1_ = 0;
      for (k = 0; k < preferred_hk[5]; k = k + 1) {
        if ((&iStack_b8)[k] == 0) {
          preferred_kex[7]._7_1_ = 1;
        }
        for (uStack_4c = 0; uStack_4c < 0x11; uStack_4c = uStack_4c + 1) {
          if ((ssh2_hostkey_algs[(int)uStack_4c].id == (&iStack_b8)[k]) &&
             (_Var5 = ssh_transient_hostkey_cache_has(thc,ssh2_hostkey_algs[(int)uStack_4c].alg),
             _Var5)) {
            pkVar9 = ssh2_kexinit_addalg(kexlists + 1,
                                         (ssh2_hostkey_algs[(int)uStack_4c].alg)->ssh_id);
            (pkVar9->u).kex.kex = (ssh_kex *)ssh2_hostkey_algs[(int)uStack_4c].alg;
            (pkVar9->u).hk.warn = (_Bool)(preferred_kex[7]._7_1_ & 1);
          }
        }
      }
    }
    else {
      if (hk_prev == (ssh_keyalg *)0x0) {
        __assert_fail("hk_prev",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/transport2.c"
                      ,0x329,
                      "void ssh2_write_kexinit_lists(BinarySink *, struct kexinit_algorithm_list *, Conf *, const SshServerConfig *, int, const char *, int, const ssh_keyalg *, ssh_transient_hostkey_cache *, tree234 *, ssh_key *const *, int, _Bool, _Bool, _Bool)"
                     );
      }
      pkVar9 = ssh2_kexinit_addalg(kexlists + 1,hk_prev->ssh_id);
      (pkVar9->u).hk.hostkey = hk_prev;
      (pkVar9->u).hk.warn = false;
    }
  }
  else {
    for (k = 0; k < our_nhostkeys; k = k + 1) {
      self = ssh_key_alg(our_hostkeys[k]);
      pkVar9 = ssh2_kexinit_addalg(kexlists + 1,self->ssh_id);
      (pkVar9->u).hk.hostkey = self;
      (pkVar9->u).hk.hkflags = 0;
      (pkVar9->u).hk.warn = false;
      uVar7 = ssh_keyalg_supported_flags(self);
      for (uStack_140 = 0; uStack_140 < 2; uStack_140 = uStack_140 + 1) {
        if ((ssh2_write_kexinit_lists::try_flags[uStack_140] & (uVar7 ^ 0xffffffff)) == 0) {
          name_00 = ssh_keyalg_alternate_ssh_id
                              (self,ssh2_write_kexinit_lists::try_flags[uStack_140]);
          pkVar9 = ssh2_kexinit_addalg(kexlists + 1,name_00);
          (pkVar9->u).hk.hostkey = self;
          (pkVar9->u).hk.hkflags = ssh2_write_kexinit_lists::try_flags[uStack_140];
          (pkVar9->u).hk.warn = false;
        }
      }
    }
  }
  if (can_gssapi_keyex) {
    pkVar9 = ssh2_kexinit_addalg(kexlists + 1,"null");
    (pkVar9->u).kex.kex = (ssh_kex *)0x0;
  }
  for (n_preferred_kex = 2; n_preferred_kex < 4; n_preferred_kex = n_preferred_kex + 1) {
    preferred_kex[7]._7_1_ = 0;
    for (k = 0; k < preferred_ciphers[6]._4_4_; k = k + 1) {
      psVar2 = preferred_ciphers[(long)k + -1];
      if (psVar2 == (ssh2_ciphers *)0x0) {
        preferred_kex[7]._7_1_ = 1;
      }
      else {
        for (uStack_4c = 0; (int)uStack_4c < psVar2->nciphers; uStack_4c = uStack_4c + 1) {
          pkVar9 = ssh2_kexinit_addalg(kexlists + n_preferred_kex,
                                       psVar2->list[(int)uStack_4c]->ssh2_id);
          (pkVar9->u).kex.kex = (ssh_kex *)psVar2->list[(int)uStack_4c];
          (pkVar9->u).kex.warn = (_Bool)(preferred_kex[7]._7_1_ & 1);
        }
      }
    }
  }
  if ((remote_bugs & 2U) == 0) {
    ppsStack_108 = macs;
    alg._4_4_ = 4;
  }
  else {
    ppsStack_108 = buggymacs;
    alg._4_4_ = 3;
  }
  for (uStack_4c = 4; (int)uStack_4c < 6; uStack_4c = uStack_4c + 1) {
    for (k = 0; k < alg._4_4_; k = k + 1) {
      pkVar9 = ssh2_kexinit_addalg(kexlists + (int)uStack_4c,ppsStack_108[k]->name);
      (pkVar9->u).kex.kex = (ssh_kex *)ppsStack_108[k];
      (pkVar9->u).kex.warn = false;
    }
    for (k = 0; k < alg._4_4_; k = k + 1) {
      if (ppsStack_108[k]->etm_name != (char *)0x0) {
        pkVar9 = ssh2_kexinit_addalg(kexlists + (int)uStack_4c,ppsStack_108[k]->etm_name);
        (pkVar9->u).kex.kex = (ssh_kex *)ppsStack_108[k];
        (pkVar9->u).kex.warn = true;
      }
    }
  }
  for (uStack_4c = 6; (int)uStack_4c < 8; uStack_4c = uStack_4c + 1) {
    pkVar9 = ssh2_kexinit_addalg(kexlists + (int)uStack_4c,(char *)*maclist);
    (pkVar9->u).kex.kex = (ssh_kex *)maclist;
    (pkVar9->u).kex.warn = false;
    if (maclist[1] != (ssh2_macalg *)0x0) {
      pkVar9 = ssh2_kexinit_addalg(kexlists + (int)uStack_4c,(char *)maclist[1]);
      (pkVar9->u).kex.kex = (ssh_kex *)maclist;
      (pkVar9->u).kex.warn = true;
    }
    for (k = 0; (uint)k < 2; k = k + 1) {
      psVar3 = compressions[k];
      pkVar9 = ssh2_kexinit_addalg(kexlists + (int)uStack_4c,psVar3->name);
      (pkVar9->u).kex.kex = (ssh_kex *)psVar3;
      (pkVar9->u).kex.warn = false;
      if (psVar3->delayed_name != (char *)0x0) {
        pkVar9 = ssh2_kexinit_addalg(kexlists + (int)uStack_4c,psVar3->delayed_name);
        (pkVar9->u).kex.kex = (ssh_kex *)psVar3;
        (pkVar9->u).kex.warn = true;
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    psVar11 = strbuf_new();
    if ((ssc == (SshServerConfig *)0x0) || (ssc->kex_override[k].ptr == (void *)0x0)) {
      for (uStack_4c = 0; (ulong)(long)(int)uStack_4c < kexlists[k].nalgs; uStack_4c = uStack_4c + 1
          ) {
        add_to_commasep_pl(psVar11,kexlists[k].algs[(int)uStack_4c].name);
      }
    }
    else {
      BinarySink_put_datapl(psVar11->binarysink_,ssc->kex_override[k]);
    }
    if ((k == 0) && (first_time)) {
      if (our_hostkeys == (ssh_key **)0x0) {
        add_to_commasep(psVar11,"ext-info-c");
      }
      else {
        add_to_commasep(psVar11,"ext-info-s");
      }
    }
    BinarySink_put_stringsb(pktout->binarysink_,psVar11);
  }
  BinarySink_put_stringz(pktout->binarysink_,anon_var_dwarf_248df + 10);
  BinarySink_put_stringz(pktout->binarysink_,anon_var_dwarf_248df + 10);
  return;
}

Assistant:

static void ssh2_write_kexinit_lists(
    BinarySink *pktout,
    struct kexinit_algorithm_list kexlists[NKEXLIST],
    Conf *conf, const SshServerConfig *ssc, int remote_bugs,
    const char *hk_host, int hk_port, const ssh_keyalg *hk_prev,
    ssh_transient_hostkey_cache *thc, tree234 *host_cas,
    ssh_key *const *our_hostkeys, int our_nhostkeys,
    bool first_time, bool can_gssapi_keyex, bool transient_hostkey_mode)
{
    int i, j, k;
    bool warn;

    int n_preferred_kex;
    const ssh_kexes *preferred_kex[KEX_MAX + 1]; /* +1 for GSSAPI */
    int n_preferred_hk;
    int preferred_hk[HK_MAX];
    int n_preferred_ciphers;
    const ssh2_ciphers *preferred_ciphers[CIPHER_MAX];
    const ssh_compression_alg *preferred_comp;
    const ssh2_macalg *const *maclist;
    int nmacs;

    struct kexinit_algorithm *alg;

    /*
     * Set up the preferred key exchange. (NULL => warn below here)
     */
    n_preferred_kex = 0;
    if (can_gssapi_keyex)
        preferred_kex[n_preferred_kex++] = &ssh_gssk5_sha1_kex;
    for (i = 0; i < KEX_MAX; i++) {
        switch (conf_get_int_int(conf, CONF_ssh_kexlist, i)) {
          case KEX_DHGEX:
            preferred_kex[n_preferred_kex++] =
                &ssh_diffiehellman_gex;
            break;
          case KEX_DHGROUP14:
            preferred_kex[n_preferred_kex++] =
                &ssh_diffiehellman_group14;
            break;
          case KEX_DHGROUP1:
            preferred_kex[n_preferred_kex++] =
                &ssh_diffiehellman_group1;
            break;
          case KEX_RSA:
            preferred_kex[n_preferred_kex++] =
                &ssh_rsa_kex;
            break;
          case KEX_ECDH:
            preferred_kex[n_preferred_kex++] =
                &ssh_ecdh_kex;
            break;
          case KEX_NTRU_HYBRID:
            preferred_kex[n_preferred_kex++] =
                &ssh_ntru_hybrid_kex;
            break;
          case KEX_WARN:
            /* Flag for later. Don't bother if it's the last in
             * the list. */
            if (i < KEX_MAX - 1) {
                preferred_kex[n_preferred_kex++] = NULL;
            }
            break;
        }
    }

    /*
     * Set up the preferred host key types. These are just the ids
     * in the enum in putty.h, so 'warn below here' is indicated
     * by HK_WARN.
     */
    n_preferred_hk = 0;
    for (i = 0; i < HK_MAX; i++) {
        int id = conf_get_int_int(conf, CONF_ssh_hklist, i);
        /* As above, don't bother with HK_WARN if it's last in the
         * list */
        if (id != HK_WARN || i < HK_MAX - 1)
            preferred_hk[n_preferred_hk++] = id;
    }

    /*
     * Set up the preferred ciphers. (NULL => warn below here)
     */
    n_preferred_ciphers = 0;
    for (i = 0; i < CIPHER_MAX; i++) {
        switch (conf_get_int_int(conf, CONF_ssh_cipherlist, i)) {
          case CIPHER_BLOWFISH:
            preferred_ciphers[n_preferred_ciphers++] = &ssh2_blowfish;
            break;
          case CIPHER_DES:
            if (conf_get_bool(conf, CONF_ssh2_des_cbc))
                preferred_ciphers[n_preferred_ciphers++] = &ssh2_des;
            break;
          case CIPHER_3DES:
            preferred_ciphers[n_preferred_ciphers++] = &ssh2_3des;
            break;
          case CIPHER_AES:
            preferred_ciphers[n_preferred_ciphers++] = &ssh2_aes;
            break;
          case CIPHER_ARCFOUR:
            preferred_ciphers[n_preferred_ciphers++] = &ssh2_arcfour;
            break;
          case CIPHER_CHACHA20:
            preferred_ciphers[n_preferred_ciphers++] = &ssh2_ccp;
            break;
          case CIPHER_WARN:
            /* Flag for later. Don't bother if it's the last in
             * the list. */
            if (i < CIPHER_MAX - 1) {
                preferred_ciphers[n_preferred_ciphers++] = NULL;
            }
            break;
        }
    }

    /*
     * Set up preferred compression.
     */
    if (conf_get_bool(conf, CONF_compression))
        preferred_comp = &ssh_zlib;
    else
        preferred_comp = &ssh_comp_none;

    for (i = 0; i < NKEXLIST; i++)
        kexlists[i].nalgs = 0;
    /* List key exchange algorithms. */
    warn = false;
    for (i = 0; i < n_preferred_kex; i++) {
        const ssh_kexes *k = preferred_kex[i];
        if (!k) warn = true;
        else for (j = 0; j < k->nkexes; j++) {
                alg = ssh2_kexinit_addalg(&kexlists[KEXLIST_KEX],
                                          k->list[j]->name);
                alg->u.kex.kex = k->list[j];
                alg->u.kex.warn = warn;
            }
    }
    /* List server host key algorithms. */
    if (our_hostkeys) {
        /*
         * In server mode, we just list the algorithms that match the
         * host keys we actually have.
         */
        for (i = 0; i < our_nhostkeys; i++) {
            const ssh_keyalg *keyalg = ssh_key_alg(our_hostkeys[i]);

            alg = ssh2_kexinit_addalg(&kexlists[KEXLIST_HOSTKEY],
                                      keyalg->ssh_id);
            alg->u.hk.hostkey = keyalg;
            alg->u.hk.hkflags = 0;
            alg->u.hk.warn = false;

            uint32_t supported_flags = ssh_keyalg_supported_flags(keyalg);
            static const uint32_t try_flags[] = {
                SSH_AGENT_RSA_SHA2_256,
                SSH_AGENT_RSA_SHA2_512,
            };
            for (size_t i = 0; i < lenof(try_flags); i++) {
                if (try_flags[i] & ~supported_flags)
                    continue;          /* these flags not supported */

                alg = ssh2_kexinit_addalg(
                    &kexlists[KEXLIST_HOSTKEY],
                    ssh_keyalg_alternate_ssh_id(keyalg, try_flags[i]));

                alg->u.hk.hostkey = keyalg;
                alg->u.hk.hkflags = try_flags[i];
                alg->u.hk.warn = false;
            }
        }
    } else if (first_time) {
        /*
         * In the first key exchange, we list all the algorithms we're
         * prepared to cope with, but (if configured to) we prefer
         * those algorithms for which we have a host key for this
         * host.
         *
         * If the host key algorithm is below the warning
         * threshold, we warn even if we did already have a key
         * for it, on the basis that if the user has just
         * reconfigured that host key type to be warned about,
         * they surely _do_ want to be alerted that a server
         * they're actually connecting to is using it.
         */

        bool accept_certs = false;
        {
            host_ca_enum *handle = enum_host_ca_start();
            if (handle) {
                strbuf *name = strbuf_new();
                while (strbuf_clear(name), enum_host_ca_next(handle, name)) {
                    host_ca *hca = host_ca_load(name->s);
                    if (!hca)
                        continue;

                    if (hca->ca_public_key &&
                        cert_expr_match_str(hca->validity_expression,
                                            hk_host, hk_port)) {
                        accept_certs = true;
                        add234(host_cas, hca);
                    } else {
                        host_ca_free(hca);
                    }
                }
                enum_host_ca_finish(handle);
                strbuf_free(name);
            }
        }

        if (accept_certs) {
            /* Add all the certificate algorithms first, in preference order */
            warn = false;
            for (i = 0; i < n_preferred_hk; i++) {
                if (preferred_hk[i] == HK_WARN)
                    warn = true;
                for (j = 0; j < lenof(ssh2_hostkey_algs); j++) {
                    const struct ssh_signkey_with_user_pref_id *a =
                        &ssh2_hostkey_algs[j];
                    if (!a->alg->is_certificate)
                        continue;
                    if (a->id != preferred_hk[i])
                        continue;
                    alg = ssh2_kexinit_addalg(&kexlists[KEXLIST_HOSTKEY],
                                              a->alg->ssh_id);
                    alg->u.hk.hostkey = a->alg;
                    alg->u.hk.warn = warn;
                }
            }
        }

        /* Next, add algorithms we already know a key for (unless
         * configured not to do that) */
        warn = false;
        for (i = 0; i < n_preferred_hk; i++) {
            if (preferred_hk[i] == HK_WARN)
                warn = true;
            for (j = 0; j < lenof(ssh2_hostkey_algs); j++) {
                const struct ssh_signkey_with_user_pref_id *a =
                    &ssh2_hostkey_algs[j];
                if (a->alg->is_certificate && accept_certs)
                    continue;          /* already added this one */
                if (a->id != preferred_hk[i])
                    continue;
                if (conf_get_bool(conf, CONF_ssh_prefer_known_hostkeys) &&
                    have_ssh_host_key(hk_host, hk_port,
                                      a->alg->cache_id)) {
                    alg = ssh2_kexinit_addalg(&kexlists[KEXLIST_HOSTKEY],
                                              a->alg->ssh_id);
                    alg->u.hk.hostkey = a->alg;
                    alg->u.hk.warn = warn;
                }
            }
        }

        /* And finally, everything else */
        warn = false;
        for (i = 0; i < n_preferred_hk; i++) {
            if (preferred_hk[i] == HK_WARN)
                warn = true;
            for (j = 0; j < lenof(ssh2_hostkey_algs); j++) {
                const struct ssh_signkey_with_user_pref_id *a =
                    &ssh2_hostkey_algs[j];
                if (a->alg->is_certificate)
                    continue;
                if (a->id != preferred_hk[i])
                    continue;
                alg = ssh2_kexinit_addalg(&kexlists[KEXLIST_HOSTKEY],
                                          a->alg->ssh_id);
                alg->u.hk.hostkey = a->alg;
                alg->u.hk.warn = warn;
            }
        }
#ifndef NO_GSSAPI
    } else if (transient_hostkey_mode) {
        /*
         * If we've previously done a GSSAPI KEX, then we list
         * precisely the algorithms for which a previous GSS key
         * exchange has delivered us a host key, because we expect
         * one of exactly those keys to be used in any subsequent
         * non-GSS-based rekey.
         *
         * An exception is if this is the key exchange we
         * triggered for the purposes of populating that cache -
         * in which case the cache will currently be empty, which
         * isn't helpful!
         */
        warn = false;
        for (i = 0; i < n_preferred_hk; i++) {
            if (preferred_hk[i] == HK_WARN)
                warn = true;
            for (j = 0; j < lenof(ssh2_hostkey_algs); j++) {
                if (ssh2_hostkey_algs[j].id != preferred_hk[i])
                    continue;
                if (ssh_transient_hostkey_cache_has(
                        thc, ssh2_hostkey_algs[j].alg)) {
                    alg = ssh2_kexinit_addalg(&kexlists[KEXLIST_HOSTKEY],
                                              ssh2_hostkey_algs[j].alg->ssh_id);
                    alg->u.hk.hostkey = ssh2_hostkey_algs[j].alg;
                    alg->u.hk.warn = warn;
                }
            }
        }
#endif
    } else {
        /*
         * In subsequent key exchanges, we list only the host key
         * algorithm that was selected in the first key exchange,
         * so that we keep getting the same host key and hence
         * don't have to interrupt the user's session to ask for
         * reverification.
         */
        assert(hk_prev);
        alg = ssh2_kexinit_addalg(&kexlists[KEXLIST_HOSTKEY], hk_prev->ssh_id);
        alg->u.hk.hostkey = hk_prev;
        alg->u.hk.warn = false;
    }
    if (can_gssapi_keyex) {
        alg = ssh2_kexinit_addalg(&kexlists[KEXLIST_HOSTKEY], "null");
        alg->u.hk.hostkey = NULL;
    }
    /* List encryption algorithms (client->server then server->client). */
    for (k = KEXLIST_CSCIPHER; k <= KEXLIST_SCCIPHER; k++) {
        warn = false;
#ifdef FUZZING
        alg = ssh2_kexinit_addalg(&kexlists[K], "none");
        alg->u.cipher.cipher = NULL;
        alg->u.cipher.warn = warn;
#endif /* FUZZING */
        for (i = 0; i < n_preferred_ciphers; i++) {
            const ssh2_ciphers *c = preferred_ciphers[i];
            if (!c) warn = true;
            else for (j = 0; j < c->nciphers; j++) {
                    alg = ssh2_kexinit_addalg(&kexlists[k],
                                              c->list[j]->ssh2_id);
                    alg->u.cipher.cipher = c->list[j];
                    alg->u.cipher.warn = warn;
                }
        }
    }

    /*
     * Be prepared to work around the buggy MAC problem.
     */
    if (remote_bugs & BUG_SSH2_HMAC) {
        maclist = buggymacs;
        nmacs = lenof(buggymacs);
    } else {
        maclist = macs;
        nmacs = lenof(macs);
    }

    /* List MAC algorithms (client->server then server->client). */
    for (j = KEXLIST_CSMAC; j <= KEXLIST_SCMAC; j++) {
#ifdef FUZZING
        alg = ssh2_kexinit_addalg(kexlists[j], "none");
        alg->u.mac.mac = NULL;
        alg->u.mac.etm = false;
#endif /* FUZZING */
        for (i = 0; i < nmacs; i++) {
            alg = ssh2_kexinit_addalg(&kexlists[j], maclist[i]->name);
            alg->u.mac.mac = maclist[i];
            alg->u.mac.etm = false;
        }
        for (i = 0; i < nmacs; i++) {
            /* For each MAC, there may also be an ETM version,
             * which we list second. */
            if (maclist[i]->etm_name) {
                alg = ssh2_kexinit_addalg(&kexlists[j], maclist[i]->etm_name);
                alg->u.mac.mac = maclist[i];
                alg->u.mac.etm = true;
            }
        }
    }

    /* List client->server compression algorithms,
     * then server->client compression algorithms. (We use the
     * same set twice.) */
    for (j = KEXLIST_CSCOMP; j <= KEXLIST_SCCOMP; j++) {
        assert(lenof(compressions) > 1);
        /* Prefer non-delayed versions */
        alg = ssh2_kexinit_addalg(&kexlists[j], preferred_comp->name);
        alg->u.comp.comp = preferred_comp;
        alg->u.comp.delayed = false;
        if (preferred_comp->delayed_name) {
            alg = ssh2_kexinit_addalg(&kexlists[j],
                                      preferred_comp->delayed_name);
            alg->u.comp.comp = preferred_comp;
            alg->u.comp.delayed = true;
        }
        for (i = 0; i < lenof(compressions); i++) {
            const ssh_compression_alg *c = compressions[i];
            alg = ssh2_kexinit_addalg(&kexlists[j], c->name);
            alg->u.comp.comp = c;
            alg->u.comp.delayed = false;
            if (c->delayed_name) {
                alg = ssh2_kexinit_addalg(&kexlists[j], c->delayed_name);
                alg->u.comp.comp = c;
                alg->u.comp.delayed = true;
            }
        }
    }

    /*
     * Finally, format the lists into text and write them into the
     * outgoing KEXINIT packet.
     */
    for (i = 0; i < NKEXLIST; i++) {
        strbuf *list = strbuf_new();
        if (ssc && ssc->kex_override[i].ptr) {
            put_datapl(list, ssc->kex_override[i]);
        } else {
            for (j = 0; j < kexlists[i].nalgs; j++)
                add_to_commasep_pl(list, kexlists[i].algs[j].name);
        }
        if (i == KEXLIST_KEX && first_time) {
            if (our_hostkeys)          /* we're the server */
                add_to_commasep(list, "ext-info-s");
            else                       /* we're the client */
                add_to_commasep(list, "ext-info-c");
        }
        put_stringsb(pktout, list);
    }
    /* List client->server languages. Empty list. */
    put_stringz(pktout, "");
    /* List server->client languages. Empty list. */
    put_stringz(pktout, "");
}